

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QList<QGraphicsItem_*>_>::moveAppend
          (QGenericArrayOps<QList<QGraphicsItem_*>_> *this,QList<QGraphicsItem_*> *b,
          QList<QGraphicsItem_*> *e)

{
  qsizetype *pqVar1;
  QList<QGraphicsItem_*> *pQVar2;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QList<QGraphicsItem_*>_>).ptr;
    for (; b < e; b = (QList<QGraphicsItem_*> *)(&b->d + 1)) {
      QArrayDataPointer<QGraphicsItem_*>::QArrayDataPointer
                (&pQVar2[(this->super_QArrayDataPointer<QList<QGraphicsItem_*>_>).size].d,&b->d);
      pqVar1 = &(this->super_QArrayDataPointer<QList<QGraphicsItem_*>_>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }